

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::Int64Option::fillGranularityDomain
          (Int64Option *this,int granularity,vector<long,_std::allocator<long>_> *values)

{
  long *plVar1;
  pointer plVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int i;
  long lVar9;
  
  std::vector<long,_std::allocator<long>_>::resize(values,(long)granularity);
  lVar6 = this->value;
  plVar1 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  *plVar1 = lVar6;
  lVar7 = 0x200;
  if (lVar6 < 16000) {
    lVar7 = 0x40;
  }
  lVar9 = 1;
  if (lVar6 < 0x10) {
    lVar7 = lVar9;
  }
  if (granularity < 2) {
    iVar5 = 1;
  }
  else {
    plVar1[1] = this->defaultValue;
    iVar5 = 2;
  }
  do {
    lVar6 = lVar7;
    if (granularity <= iVar5) break;
    if ((lVar6 != 0) && (lVar7 = this->value + lVar6, lVar7 <= (this->range).end)) {
      lVar8 = (long)iVar5;
      iVar5 = iVar5 + 1;
      plVar1[lVar8] = lVar7;
    }
    if ((iVar5 < granularity) && (lVar7 = this->value - lVar6, (this->range).begin <= lVar7)) {
      lVar8 = (long)iVar5;
      iVar5 = iVar5 + 1;
      plVar1[lVar8] = lVar7;
    }
    lVar7 = lVar6 * 4;
  } while (((lVar6 < 1) || (this->value + lVar7 <= (this->range).end)) ||
          ((this->range).begin <= this->value + lVar6 * -4));
  std::vector<long,_std::allocator<long>_>::resize(values,(long)iVar5);
  sort<long,Minisat::LessThan_default<long>>(values);
  plVar2 = (values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  iVar3 = 0;
  for (; lVar9 < iVar5; lVar9 = lVar9 + 1) {
    iVar4 = iVar3;
    if (plVar2[lVar9] != plVar2[iVar3]) {
      iVar4 = iVar3 + 1;
      plVar2[(long)iVar3 + 1] = plVar2[lVar9];
    }
    iVar3 = iVar4;
  }
  std::vector<long,_std::allocator<long>_>::resize(values,(long)(iVar3 + 1));
  return;
}

Assistant:

void fillGranularityDomain(int granularity, std::vector<int64_t> &values)
    {
        values.resize(granularity);
        int addedValues = 0;
        values[addedValues++] = value;
        int64_t dist = value < 16 ? 1 : (value < 16000 ? 64 : 512); // smarter way to initialize the initial diff value
        if (addedValues < granularity) {
            values[addedValues++] = defaultValue;
        }
        while (addedValues < granularity) {
            if (value + dist > value && value + dist <= range.end) {
                values[addedValues++] = value + dist;
            }
            if (addedValues < granularity && value - dist >= range.begin) {
                values[addedValues++] = value - dist;
            }
            dist = dist * 4;
            if (value - dist < value && value + dist > range.end && value - dist < range.begin) {
                break;
            } // stop if there cannot be more values!
        }
        values.resize(addedValues);
        sort(values);
        int j = 0;
        assert(values[0] >= range.begin && values[0] <= range.end && "stay in bound");
        for (int i = 1; i < addedValues; ++i) {
            if (values[i] != values[j]) {
                assert(values[i] >= range.begin && values[i] <= range.end && "stay in bound");
                values[++j] = values[i];
            }
        }
        j++;
        assert(addedValues > 0 && "there has to be at least one option");
        assert(j <= addedValues && j <= granularity && "collected values hae to stay in bounds");
        values.resize(j);
    }